

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

optional<CNetAddr> * LookupHost(string *name,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  long lVar1;
  bool bVar2;
  CNetAddr *in_RCX;
  undefined1 in_DL;
  DNSLookupFn *in_RSI;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RDI;
  long in_FS_OFFSET;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_ffffffffffffff58;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *pfVar3;
  undefined4 in_stack_ffffffffffffff78;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *pfVar4;
  string *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfVar3 = in_RDI;
  pfVar4 = in_RDI;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)(ulong)(CONCAT14(in_DL,in_stack_ffffffffffffff78) & 0x1ffffffff),in_RDI);
  LookupHost(in_stack_ffffffffffffffc0,(uint)((ulong)pfVar4 >> 0x20),SUB81((ulong)pfVar4 >> 0x18,0),
             in_RSI);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function(in_stack_ffffffffffffff58);
  bVar2 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::empty
                    ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_RDI);
  if (bVar2) {
    std::optional<CNetAddr>::optional((optional<CNetAddr> *)in_RDI);
  }
  else {
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::front
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_RCX);
    std::make_optional<CNetAddr_const&>(in_RCX);
  }
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<CNetAddr> *)pfVar3;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CNetAddr> LookupHost(const std::string& name, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CNetAddr> addresses{LookupHost(name, 1, fAllowLookup, dns_lookup_function)};
    return addresses.empty() ? std::nullopt : std::make_optional(addresses.front());
}